

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disabled_disk_io.cpp
# Opt level: O3

void __thiscall
libtorrent::disabled_disk_io::async_read
          (disabled_disk_io *this,storage_index_t param_1,peer_request *r,
          function<void_(libtorrent::disk_buffer_holder,_const_libtorrent::storage_error_&)>
          *handler,disk_job_flags_t param_4)

{
  _Manager_type p_Var1;
  type local_48;
  io_context *local_20;
  undefined4 local_14;
  
  local_20 = this->m_ios;
  local_48.h.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_48.h.super__Function_base._M_functor._8_8_ = 0;
  local_48.h.super__Function_base._M_manager = (_Manager_type)0x0;
  local_48.h._M_invoker = handler->_M_invoker;
  p_Var1 = (handler->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_48.h.super__Function_base._M_functor._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(handler->super__Function_base)._M_functor;
    local_48.h.super__Function_base._M_functor._8_8_ =
         *(undefined8 *)((long)&(handler->super__Function_base)._M_functor + 8);
    (handler->super__Function_base)._M_manager = (_Manager_type)0x0;
    handler->_M_invoker = (_Invoker_type)0x0;
    local_48.h.super__Function_base._M_manager = p_Var1;
  }
  local_14 = 1;
  local_48.this = this;
  boost::asio::io_context::basic_executor_type<std::allocator<void>,0u>::
  execute<libtorrent::disabled_disk_io::async_read(libtorrent::aux::strong_typedef<unsigned_int,libtorrent::storage_index_tag_t,void>,libtorrent::peer_request_const&,std::function<void(libtorrent::disk_buffer_holder,libtorrent::storage_error_const&)>,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::disk_job_flags_tag,void>)::_lambda()_1_>
            ((basic_executor_type<std::allocator<void>,0u> *)&local_20,&local_48);
  if (local_48.h.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_48.h.super__Function_base._M_manager)
              ((_Any_data *)&local_48.h,(_Any_data *)&local_48.h,__destroy_functor);
  }
  return;
}

Assistant:

void async_read(storage_index_t, peer_request const& r
		, std::function<void(disk_buffer_holder, storage_error const&)> handler
		, disk_job_flags_t) override
	{
		TORRENT_ASSERT(r.length <= default_block_size);
		TORRENT_UNUSED(r);

		post(m_ios, [this, h = std::move(handler)] {
			h(disk_buffer_holder(*this, this->m_zero_buffer.get(), default_block_size)
				, storage_error{});
		});
	}